

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhCellWriteOvflPayload(lhcell *pCell,void *pKey,sxu32 nKeylen,...)

{
  lhpage *plVar1;
  lhash_kv_engine *pEngine;
  unqlite_page *puVar2;
  char in_AL;
  int iVar3;
  uint uVar4;
  unqlite_page **ppuVar5;
  undefined8 in_RCX;
  ulong uVar6;
  uchar *puVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  void *pvVar8;
  unqlite_page *puVar9;
  uint uVar10;
  uchar *puVar11;
  unqlite_page *puVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  unqlite_page *pOvfl;
  unqlite_page *pNew;
  va_list ap;
  unqlite_page *local_120;
  unqlite_page *local_118;
  lhcell *local_110;
  ulong local_108;
  unqlite_page **local_100;
  undefined1 *local_f8;
  unqlite_page *local_f0;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  plVar1 = pCell->pPage;
  pEngine = plVar1->pHash;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  local_110._0_4_ = lhAcquirePage(pEngine,&local_120);
  local_f0 = local_120;
  if (((int)local_110 == 0) &&
     (local_110._0_4_ = (*pEngine->pIo->xWrite)(local_120), (int)local_110 == 0)) {
    uVar6 = local_f0->iPage;
    pCell->iOvfl = uVar6;
    *(ulong *)(plVar1->pRaw->zData + (ulong)pCell->iStart + 0x12) =
         uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
         (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
         (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    puVar11 = local_f0->zData;
    puVar11[0] = '\0';
    puVar11[1] = '\0';
    puVar11[2] = '\0';
    puVar11[3] = '\0';
    puVar11[4] = '\0';
    puVar11[5] = '\0';
    puVar11[6] = '\0';
    puVar11[7] = '\0';
    puVar11 = local_f0->zData + 0x12;
    puVar7 = local_f0->zData + pEngine->iPageSize;
    local_118 = local_f0;
    local_110 = pCell;
    if (nKeylen != 0) {
      pvVar8 = (void *)((ulong)nKeylen + (long)pKey);
      do {
        if (puVar7 <= puVar11) {
          iVar3 = lhAcquirePage(pEngine,&local_118);
          puVar9 = local_118;
          if (iVar3 != 0) {
            return iVar3;
          }
          iVar3 = (*pEngine->pIo->xWrite)(local_118);
          if (iVar3 != 0) {
            return iVar3;
          }
          uVar6 = puVar9->iPage;
          *(ulong *)local_120->zData =
               uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
               | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 |
               (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
          (*pEngine->pIo->xPageUnref)(local_120);
          puVar11 = puVar9->zData;
          puVar11[0] = '\0';
          puVar11[1] = '\0';
          puVar11[2] = '\0';
          puVar11[3] = '\0';
          puVar11[4] = '\0';
          puVar11[5] = '\0';
          puVar11[6] = '\0';
          puVar11[7] = '\0';
          local_120 = puVar9;
          puVar11 = puVar9->zData + 8;
          puVar7 = puVar9->zData + pEngine->iPageSize;
        }
        uVar4 = (int)puVar7 - (int)puVar11;
        uVar10 = (int)pvVar8 - (int)pKey;
        if (uVar4 <= uVar10) {
          uVar10 = uVar4;
        }
        SyMemcpy(pKey,puVar11,uVar10);
        pKey = (void *)((long)pKey + (ulong)uVar10);
        puVar11 = puVar11 + uVar10;
      } while (pKey < pvVar8);
    }
    local_f8 = local_e8;
    local_100 = &pOvfl;
    local_108 = 0x3000000018;
    uVar6 = local_118->iPage;
    local_110->iDataPage = uVar6;
    local_110->iDataOfft = (short)puVar11 - (short)*(undefined4 *)&local_118->zData;
    *(ulong *)(local_f0->zData + 8) =
         uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
         (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
         (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    *(sxu16 *)(local_f0->zData + 0x10) = local_110->iDataOfft << 8 | local_110->iDataOfft >> 8;
    do {
      uVar6 = local_108 & 0xffffffff;
      if (uVar6 < 0x29) {
        local_108 = CONCAT44(local_108._4_4_,(int)local_108 + 8);
        ppuVar5 = (unqlite_page **)(local_f8 + uVar6);
      }
      else {
        ppuVar5 = local_100;
        local_100 = local_100 + 1;
      }
      puVar9 = *ppuVar5;
      uVar6 = local_108 & 0xffffffff;
      if (uVar6 < 0x29) {
        local_108 = CONCAT44(local_108._4_4_,(int)local_108 + 8);
        ppuVar5 = (unqlite_page **)(local_f8 + uVar6);
      }
      else {
        ppuVar5 = local_100;
        local_100 = local_100 + 1;
      }
      if (puVar9 == (unqlite_page *)0x0) {
        iVar3 = 4;
      }
      else {
        iVar3 = 0;
        if (0 < (long)*ppuVar5) {
          puVar12 = (unqlite_page *)((long)&puVar9->zData + (long)&(*ppuVar5)->zData);
          do {
            if (puVar7 <= puVar11) {
              iVar3 = lhAcquirePage(pEngine,&local_118);
              puVar2 = local_118;
              if ((iVar3 != 0) || (iVar3 = (*pEngine->pIo->xWrite)(local_118), iVar3 != 0)) {
                local_110 = (lhcell *)CONCAT44(local_110._4_4_,iVar3);
                iVar3 = 1;
                goto LAB_00114cb1;
              }
              uVar6 = puVar2->iPage;
              *(ulong *)local_120->zData =
                   uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                   (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                   | uVar6 << 0x38;
              (*pEngine->pIo->xPageUnref)(local_120);
              puVar11 = puVar2->zData;
              puVar11[0] = '\0';
              puVar11[1] = '\0';
              puVar11[2] = '\0';
              puVar11[3] = '\0';
              puVar11[4] = '\0';
              puVar11[5] = '\0';
              puVar11[6] = '\0';
              puVar11[7] = '\0';
              local_120 = puVar2;
              puVar11 = puVar2->zData + 8;
              puVar7 = puVar2->zData + pEngine->iPageSize;
            }
            uVar4 = (int)puVar7 - (int)puVar11;
            uVar10 = (int)puVar12 - (int)puVar9;
            if (uVar4 <= uVar10) {
              uVar10 = uVar4;
            }
            SyMemcpy(puVar9,puVar11,uVar10);
            puVar9 = (unqlite_page *)((long)&puVar9->zData + (ulong)uVar10);
            puVar11 = puVar11 + uVar10;
          } while (puVar9 < puVar12);
          iVar3 = 0;
        }
      }
LAB_00114cb1:
    } while (iVar3 == 0);
    if (iVar3 == 4) {
      (*pEngine->pIo->xPageUnref)(local_120);
      local_110._0_4_ = 0;
    }
    else {
    }
  }
  return (int)local_110;
}

Assistant:

static int lhCellWriteOvflPayload(lhcell *pCell,const void *pKey,sxu32 nKeylen,...)
{
	lhpage *pPage = pCell->pPage;
	lhash_kv_engine *pEngine = pPage->pHash;
	unqlite_page *pOvfl,*pFirst,*pNew;
	const unsigned char *zPtr,*zEnd;
	unsigned char *zRaw,*zRawEnd;
	sxu32 nAvail;
	va_list ap;
	int rc;
	/* Acquire a new overflow page */
	rc = lhAcquirePage(pEngine,&pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Acquire a writer lock */
	rc = pEngine->pIo->xWrite(pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	pFirst = pOvfl;
	/* Link */
	pCell->iOvfl = pOvfl->iPage;
	/* Update the cell header */
	SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4/*Hash*/ + 4/*Key*/ + 8/*Data*/ + 2 /*Next cell*/],pCell->iOvfl);
	/* Start the write process */
	zPtr = (const unsigned char *)pKey;
	zEnd = &zPtr[nKeylen];
	SyBigEndianPack64(pOvfl->zData,0); /* Next overflow page on the chain */
	zRaw = &pOvfl->zData[8/* Next ovfl page*/ + 8 /* Data page */ + 2 /* Data offset*/];
	zRawEnd = &pOvfl->zData[pEngine->iPageSize];
	pNew = pOvfl;
	/* Write the key */
	for(;;){
		if( zPtr >= zEnd ){
			break;
		}
		if( zRaw >= zRawEnd ){
			/* Acquire a new page */
			rc = lhAcquirePage(pEngine,&pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			rc = pEngine->pIo->xWrite(pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Link */
			SyBigEndianPack64(pOvfl->zData,pNew->iPage);
			pEngine->pIo->xPageUnref(pOvfl);
			SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
			pOvfl = pNew;
			zRaw = &pNew->zData[8];
			zRawEnd = &pNew->zData[pEngine->iPageSize];
		}
		nAvail = (sxu32)(zRawEnd-zRaw);
		nKeylen = (sxu32)(zEnd-zPtr);
		if( nKeylen > nAvail ){
			nKeylen = nAvail;
		}
		SyMemcpy((const void *)zPtr,(void *)zRaw,nKeylen);
		/* Synchronize pointers */
		zPtr += nKeylen;
		zRaw += nKeylen;
	}
	rc = UNQLITE_OK;
	va_start(ap,nKeylen);
	pCell->iDataPage = pNew->iPage;
	pCell->iDataOfft = (sxu16)(zRaw-pNew->zData);
	/* Write the data page and its offset */
	SyBigEndianPack64(&pFirst->zData[8/*Next ovfl*/],pCell->iDataPage);
	SyBigEndianPack16(&pFirst->zData[8/*Next ovfl*/+8/*Data page*/],pCell->iDataOfft);
	/* Write data */
	for(;;){
		const void *pData;
		sxu32 nDatalen;
		sxu64 nData;
		pData = va_arg(ap,const void *);
		nData = va_arg(ap,sxu64);
		if( pData == 0 ){
			/* No more chunks */
			break;
		}
		/* Write this chunk */
		zPtr = (const unsigned char *)pData;
		zEnd = &zPtr[nData];
		for(;;){
			if( zPtr >= zEnd ){
				break;
			}
			if( zRaw >= zRawEnd ){
				/* Acquire a new page */
				rc = lhAcquirePage(pEngine,&pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				rc = pEngine->pIo->xWrite(pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				/* Link */
				SyBigEndianPack64(pOvfl->zData,pNew->iPage);
				pEngine->pIo->xPageUnref(pOvfl);
				SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
				pOvfl = pNew;
				zRaw = &pNew->zData[8];
				zRawEnd = &pNew->zData[pEngine->iPageSize];
			}
			nAvail = (sxu32)(zRawEnd-zRaw);
			nDatalen = (sxu32)(zEnd-zPtr);
			if( nDatalen > nAvail ){
				nDatalen = nAvail;
			}
			SyMemcpy((const void *)zPtr,(void *)zRaw,nDatalen);
			/* Synchronize pointers */
			zPtr += nDatalen;
			zRaw += nDatalen;
		}
	}
	/* Unref the overflow page */
	pEngine->pIo->xPageUnref(pOvfl);
	va_end(ap);
	return UNQLITE_OK;
}